

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String testing::internal::String::ShowWideCString(wchar_t *wide_c_str)

{
  char *a_c_str;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar1;
  long in_RSI;
  String *in_RDI;
  String SVar2;
  int in_stack_00000194;
  wchar_t *in_stack_00000198;
  String *this;
  char *in_stack_ffffffffffffffb8;
  String *this_00;
  String local_20 [2];
  
  if (in_RSI == 0) {
    String(in_RDI,in_stack_ffffffffffffffb8);
    sVar1 = extraout_RDX;
  }
  else {
    this = local_20;
    this_00 = in_RDI;
    WideStringToUtf8(in_stack_00000198,in_stack_00000194);
    a_c_str = c_str(this);
    String(this_00,a_c_str);
    ~String(this);
    sVar1 = extraout_RDX_00;
  }
  SVar2.length_ = sVar1;
  SVar2.c_str_ = (char *)in_RDI;
  return SVar2;
}

Assistant:

String String::ShowWideCString(const wchar_t * wide_c_str) {
  if (wide_c_str == NULL) return String("(null)");

  return String(internal::WideStringToUtf8(wide_c_str, -1).c_str());
}